

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::detail::character<(char)45>::invoke<std::vector<char,std::allocator<char>>>
          (result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,character<(char)45> *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  const_iterator f;
  location<std::vector<char,_std::allocator<char>_>_> *loc_00;
  bool bVar1;
  reference pcVar2;
  const_iterator l;
  region<std::vector<char,_std::allocator<char>_>_> *v;
  region<std::vector<char,_std::allocator<char>_>_> local_e0;
  success<toml::detail::region<std::vector<char,_std::allocator<char>_>_>_> local_98;
  failure_type local_49;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  char local_39;
  const_iterator cStack_38;
  char c;
  const_iterator first;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_20;
  location<std::vector<char,_std::allocator<char>_>_> *local_18;
  location<std::vector<char,_std::allocator<char>_>_> *loc_local;
  
  local_18 = (location<std::vector<char,_std::allocator<char>_>_> *)this;
  loc_local = (location<std::vector<char,_std::allocator<char>_>_> *)__return_storage_ptr__;
  local_20._M_current =
       (char *)location<std::vector<char,_std::allocator<char>_>_>::iter
                         ((location<std::vector<char,_std::allocator<char>_>_> *)this);
  local_28._M_current = (char *)location<std::vector<char,_std::allocator<char>_>_>::end(local_18);
  bVar1 = __gnu_cxx::operator==(&local_20,&local_28);
  if (bVar1) {
    none();
    result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
    result(__return_storage_ptr__,(failure_type *)((long)&first._M_current + 7));
  }
  else {
    cStack_38 = location<std::vector<char,_std::allocator<char>_>_>::iter(local_18);
    local_48._M_current =
         (char *)location<std::vector<char,_std::allocator<char>_>_>::iter(local_18);
    pcVar2 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_48);
    local_39 = *pcVar2;
    if (local_39 == '-') {
      location<std::vector<char,_std::allocator<char>_>_>::advance(local_18,1);
      loc_00 = local_18;
      f._M_current = cStack_38._M_current;
      l = location<std::vector<char,_std::allocator<char>_>_>::iter(local_18);
      region<std::vector<char,_std::allocator<char>_>_>::region
                (&local_e0,loc_00,f,(const_iterator)l._M_current);
      ok<toml::detail::region<std::vector<char,std::allocator<char>>>>
                (&local_98,(toml *)&local_e0,v);
      result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
      ::result(__return_storage_ptr__,&local_98);
      success<toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>::~success(&local_98)
      ;
      region<std::vector<char,_std::allocator<char>_>_>::~region(&local_e0);
    }
    else {
      none();
      result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
      ::result(__return_storage_ptr__,&local_49);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        static_assert(std::is_same<char, typename Cont::value_type>::value,
                      "internal error: container::value_type should be `char`.");

        if(loc.iter() == loc.end()) {return none();}
        const auto first = loc.iter();

        const char c = *(loc.iter());
        if(c != target)
        {
            return none();
        }
        loc.advance(); // update location

        return ok(region<Cont>(loc, first, loc.iter()));
    }